

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_ResolutionPass.h
# Opt level: O1

void __thiscall
soul::ResolutionPass::tryPass<soul::ResolutionPass::FunctionResolver>
          (ResolutionPass *this,RunStats *runStats,bool ignoreErrors)

{
  FunctionResolver pass;
  RewritingASTVisitor local_48;
  ResolutionPass *local_38;
  Allocator *local_30;
  ModuleBase *local_28;
  long local_20;
  undefined1 local_18;
  
  local_48.itemsReplaced = 0;
  local_30 = this->allocator;
  local_28 = this->module;
  local_20 = 0;
  local_48._vptr_RewritingASTVisitor = (_func_int **)&PTR__RewritingASTVisitor_003053f0;
  local_38 = this;
  local_18 = ignoreErrors;
  RewritingASTVisitor::visitObject(&local_48,local_28);
  runStats->numFailures = runStats->numFailures + local_20;
  runStats->numReplaced = runStats->numReplaced + local_48.itemsReplaced;
  return;
}

Assistant:

void tryPass (RunStats& runStats, bool ignoreErrors)
    {
        PassType pass (*this, ignoreErrors);
        pass.performPass();
        runStats.numFailures += pass.numFails;
        runStats.numReplaced += pass.itemsReplaced;
    }